

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

FieldType __thiscall
google::protobuf::internal::ExtensionSet::ExtensionType(ExtensionSet *this,int number)

{
  FieldType FVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  LogMessage local_58;
  LogFinisher local_19;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
               ,0x105);
    pLVar3 = LogMessage::operator<<
                       (&local_58,"Don\'t lookup extension types if they aren\'t present (1). ");
    LogFinisher::operator=(&local_19,pLVar3);
    LogMessage::~LogMessage(&local_58);
    FVar1 = '\0';
  }
  else {
    if ((pEVar2->field_0xa & 1) != 0) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                 ,0x109);
      pLVar3 = LogMessage::operator<<
                         (&local_58,"Don\'t lookup extension types if they aren\'t present (2). ");
      LogFinisher::operator=(&local_19,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
    FVar1 = pEVar2->type;
  }
  return FVar1;
}

Assistant:

FieldType ExtensionSet::ExtensionType(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == NULL) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (1). ";
    return 0;
  }
  if (ext->is_cleared) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (2). ";
  }
  return ext->type;
}